

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void __thiscall
PythonModuleClient::PythonModuleClient(PythonModuleClient *this,string *id,string *addr,int port)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_60 [32];
  string local_40 [12];
  int in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_40,in_RSI);
  std::__cxx11::string::string(local_60,in_RDX);
  AbstractModuleClient::AbstractModuleClient
            ((AbstractModuleClient *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  boost::python::wrapper<AbstractModuleClient>::wrapper((wrapper<AbstractModuleClient> *)0x3e5969);
  *in_RDI = &PTR__PythonModuleClient_005d8fc8;
  return;
}

Assistant:

PythonModuleClient(std::string id, std::string addr, int port) : AbstractModuleClient(id, addr, port){
    }